

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O1

void __thiscall Steiner::outfile(Steiner *this,string *outfileName)

{
  pointer pPVar1;
  pointer pPVar2;
  int iVar3;
  int iVar4;
  pointer pPVar5;
  long lVar6;
  long *plVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer pEVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  ofstream of;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  pointer piVar10;
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)outfileName,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"NumRoutedPins = ",0x10);
  plVar7 = (long *)std::ostream::operator<<((ostream *)&local_230,this->_init_p);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"WireLength = ",0xd);
  poVar8 = std::ostream::_M_insert<long_long>((longlong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  piVar10 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar10) {
    uVar12 = 0;
    uVar13 = 1;
    do {
      uVar9 = (ulong)piVar10[uVar12];
      uVar12 = uVar9 + 0x3f;
      if (-1 < (long)uVar9) {
        uVar12 = uVar9;
      }
      if (((this->_edges_del).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar12 >> 6) +
            (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar9 & 0x3f) & 1) == 0) {
        pPVar5 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar11 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar3 = pEVar11[uVar9].p1;
        pPVar1 = pPVar5 + iVar3;
        iVar4 = pEVar11[uVar9].p2;
        pPVar2 = pPVar5 + iVar4;
        if (pPVar5[iVar3].x != pPVar5[iVar4].x) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"H-line ",7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar1->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        if (pPVar1->y != pPVar2->y) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"V-line ",7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar2->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
      }
      piVar10 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar14 = uVar13 < (ulong)((long)(this->_MST).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2
                               );
      uVar12 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar14);
  }
  pEVar11 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_finish != pEVar11) {
    uVar12 = 0;
    uVar13 = 1;
    do {
      pPVar5 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar1 = pPVar5 + pEVar11[uVar12].p1;
      pPVar2 = pPVar5 + pEVar11[uVar12].p2;
      if (pPVar5[pEVar11[uVar12].p1].x != pPVar5[pEVar11[uVar12].p2].x) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"H-line ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar1->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      if (pPVar1->y != pPVar2->y) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"V-line ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar2->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar1->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pPVar2->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      pEVar11 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = ((long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pEVar11 >> 2) * -0x3333333333333333;
      bVar14 = uVar13 <= uVar12;
      lVar6 = uVar12 - uVar13;
      uVar12 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar14 && lVar6 != 0);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Steiner::outfile(const string& outfileName) {
  ofstream of(outfileName, ofstream::out);
  of << "NumRoutedPins = " << _init_p << endl;
  of << "WireLength = " << _MRST_cost << endl;
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    Point& p1 = _points[_newE[i].p1];
    Point& p2 = _points[_newE[i].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  of.close();
}